

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_navigationbutton.cpp
# Opt level: O0

void QtMWidgets::NavigationButton::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  Direction *pDVar1;
  Direction DVar2;
  QColor *pQVar3;
  void *_v_1;
  NavigationButton *_t_2;
  void *_v;
  NavigationButton *_t_1;
  NavigationButton *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  if (_c == InvokeMetaMethod) {
    if (_id == 0) {
      _q_pressed((NavigationButton *)_o);
    }
    else if (_id == 1) {
      _q_released((NavigationButton *)_o);
    }
  }
  else if (_c == ReadProperty) {
    pDVar1 = (Direction *)*_a;
    if (_id == 0) {
      DVar2 = direction((NavigationButton *)_o);
      *pDVar1 = DVar2;
    }
    else if (_id == 1) {
      pQVar3 = textColor((NavigationButton *)_o);
      *(undefined8 *)pDVar1 = *(undefined8 *)pQVar3;
      pDVar1[2] = *(Direction *)((long)&pQVar3->ct + 4);
      *(ushort *)(pDVar1 + 3) = (pQVar3->ct).argb.pad;
    }
    else if (_id == 2) {
      pQVar3 = arrowColor((NavigationButton *)_o);
      *(undefined8 *)pDVar1 = *(undefined8 *)pQVar3;
      pDVar1[2] = *(Direction *)((long)&pQVar3->ct + 4);
      *(ushort *)(pDVar1 + 3) = (pQVar3->ct).argb.pad;
    }
  }
  else if (_c == WriteProperty) {
    pQVar3 = (QColor *)*_a;
    if (_id == 0) {
      setDirection((NavigationButton *)_o,pQVar3->cspec);
    }
    else if (_id == 1) {
      setTextColor((NavigationButton *)_o,pQVar3);
    }
    else if (_id == 2) {
      setArrowColor((NavigationButton *)_o,pQVar3);
    }
  }
  return;
}

Assistant:

void QtMWidgets::NavigationButton::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<NavigationButton *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->_q_pressed(); break;
        case 1: _t->_q_released(); break;
        default: ;
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<NavigationButton *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< Direction*>(_v) = _t->direction(); break;
        case 1: *reinterpret_cast< QColor*>(_v) = _t->textColor(); break;
        case 2: *reinterpret_cast< QColor*>(_v) = _t->arrowColor(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<NavigationButton *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setDirection(*reinterpret_cast< Direction*>(_v)); break;
        case 1: _t->setTextColor(*reinterpret_cast< QColor*>(_v)); break;
        case 2: _t->setArrowColor(*reinterpret_cast< QColor*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
    (void)_a;
}